

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O2

void __thiscall
duckdb::Bit::NumericToBit<duckdb::uhugeint_t>(Bit *this,uhugeint_t numeric,bitstring_t *output_str)

{
  char *pcVar1;
  bitstring_t *str;
  long lVar2;
  char cStack_11;
  uhugeint_t numeric_local;
  
  str = (bitstring_t *)numeric.upper;
  numeric_local.upper = numeric.lower;
  if ((str->value).pointer.length < 0xd) {
    pcVar1 = (str->value).pointer.prefix;
  }
  else {
    pcVar1 = (str->value).pointer.ptr;
  }
  *pcVar1 = '\0';
  lVar2 = 0x10;
  while( true ) {
    pcVar1 = pcVar1 + 1;
    if (lVar2 == 0) break;
    *pcVar1 = (&cStack_11)[lVar2];
    lVar2 = lVar2 + -1;
  }
  numeric_local.lower = (uint64_t)this;
  Finalize(str);
  return;
}

Assistant:

void Bit::NumericToBit(T numeric, bitstring_t &output_str) {
	D_ASSERT(output_str.GetSize() >= sizeof(T) + 1);

	auto output = output_str.GetDataWriteable();
	auto data = const_data_ptr_cast(&numeric);

	*output = 0; // set padding to 0
	++output;
	for (idx_t idx = 0; idx < sizeof(T); ++idx) {
		output[idx] = static_cast<char>(data[sizeof(T) - idx - 1]);
	}
	Bit::Finalize(output_str);
}